

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.cpp
# Opt level: O1

void __thiscall setup::ini_entry::load(ini_entry *this,istream *is,info *i)

{
  bitset<256UL> *lead_bytes;
  byte *pbVar1;
  logger *plVar2;
  size_t i_1;
  ulong uVar3;
  flag_type result;
  _WordT _Var4;
  uint64_t set_bits;
  ulong uVar5;
  ostringstream *poVar6;
  char buffer [4];
  logger local_1a8;
  
  if ((i->version).value < 0x1030000) {
    std::istream::read((char *)is,(long)&local_1a8);
  }
  lead_bytes = &(i->header).lead_bytes;
  util::encoded_string::load(is,&this->inifile,i->codepage,lead_bytes);
  if ((this->inifile)._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&this->inifile,0,(char *)0x0,0x156e70);
  }
  util::encoded_string::load(is,&this->section,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->key,i->codepage,(bitset<256UL> *)0x0);
  util::encoded_string::load(is,&this->value,i->codepage,lead_bytes);
  item::load_condition_data(&this->super_item,is,i);
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
    std::istream::read((char *)is,(long)&local_1a8);
    uVar5 = (ulong)(byte)(undefined1)local_1a8.level;
    pbVar1 = &(anonymous_namespace)::stored_ini_flags::values;
    uVar3 = 0;
    _Var4 = 0;
    do {
      if ((uVar5 >> (uVar3 & 0x3f) & 1) != 0) {
        _Var4 = _Var4 | 1L << ((ulong)*pbVar1 & 0x3f);
        uVar5 = uVar5 & ~(1L << ((byte)uVar3 & 0x3f));
      }
      uVar3 = uVar3 + 1;
      pbVar1 = pbVar1 + 4;
    } while (uVar3 != 5);
    if (uVar5 == 0) goto LAB_00142386;
    local_1a8.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.buffer);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8.buffer,"Unexpected ",0xb);
    plVar2 = logger::operator<<(&local_1a8,&enum_names<setup::ini_entry::flags_Enum_>::name);
    poVar6 = &plVar2->buffer;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," flags: ",8);
    *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) =
         *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  }
  else {
    std::istream::read((char *)is,(long)&local_1a8);
    uVar5 = (ulong)(byte)(undefined1)local_1a8.level;
    pbVar1 = &(anonymous_namespace)::stored_ini_flags::values;
    uVar3 = 0;
    _Var4 = 0;
    do {
      if ((uVar5 >> (uVar3 & 0x3f) & 1) != 0) {
        _Var4 = _Var4 | 1L << ((ulong)*pbVar1 & 0x3f);
        uVar5 = uVar5 & ~(1L << ((byte)uVar3 & 0x3f));
      }
      uVar3 = uVar3 + 1;
      pbVar1 = pbVar1 + 4;
    } while (uVar3 != 5);
    if (uVar5 == 0) goto LAB_00142386;
    local_1a8.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.buffer);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8.buffer,"Unexpected ",0xb);
    plVar2 = logger::operator<<(&local_1a8,&enum_names<setup::ini_entry::flags_Enum_>::name);
    poVar6 = &plVar2->buffer;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," flags: ",8);
    *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) =
         *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  }
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  logger::~logger(&local_1a8);
LAB_00142386:
  (this->options)._flags.super__Base_bitset<1UL>._M_w = _Var4;
  return;
}

Assistant:

void ini_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(inifile, i.codepage, i.header.lead_bytes);
	if(inifile.empty()) {
		inifile = "{windows}/WIN.INI";
	}
	is >> util::encoded_string(section, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(key, i.codepage);
	is >> util::encoded_string(value, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	if(i.version.bits() != 16) {
		options = stored_flags<stored_ini_flags>(is).get();
	} else {
		options = stored_flags<stored_ini_flags, 16>(is).get();
	}
}